

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

bool __thiscall bench::push_back_model(bench *this,string_view name)

{
  bool bVar1;
  model *__args;
  char *in_RCX;
  string_view name_00;
  undefined1 local_58 [8];
  optional<bench::model> mdl;
  bench *this_local;
  string_view name_local;
  
  name_00._M_len = name._M_str;
  name_00._M_str = in_RCX;
  mdl.super__Optional_base<bench::model,_false,_false>._M_payload.
  super__Optional_payload<bench::model,_true,_false,_false>.
  super__Optional_payload_base<bench::model>._40_8_ = this;
  model::make_model((optional<bench::model> *)local_58,(model *)name._M_len,name_00);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_58);
  if (bVar1) {
    __args = std::optional<bench::model>::operator*((optional<bench::model> *)local_58);
    std::vector<bench::model,std::allocator<bench::model>>::emplace_back<bench::model&>
              ((vector<bench::model,std::allocator<bench::model>> *)this,__args);
  }
  std::optional<bench::model>::~optional((optional<bench::model> *)local_58);
  return bVar1;
}

Assistant:

bool push_back_model(std::string_view name)
    {
        auto mdl = model::make_model(name);

        if (!mdl)
            return false;

        models.emplace_back(*mdl);

        return true;
    }